

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbmstream_rawclient.cpp
# Opt level: O2

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  ostream *poVar4;
  size_t in_RCX;
  undefined1 auVar5 [8];
  const_iterator cVar6;
  signalReferences_t signalReferences;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  pointer local_88;
  undefined8 local_78;
  FastWriter local_70;
  ValueIteratorBase local_40;
  
  local_78 = stream;
  bVar1 = std::operator==(method,"available");
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"The following signal(s) are available : ");
    local_98 = (undefined1  [8])0x0;
    _Stack_90._M_p = (pointer)0x0;
    local_88 = (pointer)0x0;
    cVar6 = Json::Value::begin(params);
    local_40.current_ = cVar6.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar6.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar6 = Json::Value::end(params);
      local_70.super_Writer._vptr_Writer =
           (_func_int **)cVar6.super_ValueIteratorBase.current_._M_node;
      local_70.document_._M_dataplus._M_p._0_1_ = cVar6.super_ValueIteratorBase.isNull_;
      bVar1 = Json::ValueIteratorBase::operator!=(&local_40,(SelfType *)&local_70);
      if (!bVar1) break;
      pVVar3 = Json::ValueIteratorBase::deref(&local_40);
      Json::Value::asString_abi_cxx11_((string *)&local_70,pVVar3);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
      std::operator<<(poVar4,", ");
      std::__cxx11::string::~string((string *)&local_70);
      Json::Value::asString_abi_cxx11_((string *)&local_70,pVVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      Json::ValueIteratorBase::increment(&local_40);
    }
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    hbm::streaming::StreamClient::subscribe((StreamClient *)local_78,(signalReferences_t *)local_98)
    ;
    poVar4 = std::operator<<((ostream *)&std::cout,"The following ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," signal(s) were subscribed: ");
    for (auVar5 = local_98; auVar5 != (undefined1  [8])_Stack_90._M_p;
        auVar5 = (undefined1  [8])((long)auVar5 + 0x20)) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\'");
      poVar4 = std::operator<<(poVar4,(string *)auVar5);
      std::operator<<(poVar4,"\' ");
    }
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  else {
    bVar1 = std::operator==(method,"unavailable");
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"The following signal(s) are not available anyore: ");
      cVar6 = Json::Value::begin(params);
      local_98 = (undefined1  [8])cVar6.super_ValueIteratorBase.current_._M_node;
      _Stack_90._M_p._0_1_ = cVar6.super_ValueIteratorBase.isNull_;
      while( true ) {
        cVar6 = Json::Value::end(params);
        local_70.super_Writer._vptr_Writer =
             (_func_int **)cVar6.super_ValueIteratorBase.current_._M_node;
        local_70.document_._M_dataplus._M_p._0_1_ = cVar6.super_ValueIteratorBase.isNull_;
        bVar1 = Json::ValueIteratorBase::operator!=
                          ((ValueIteratorBase *)local_98,(SelfType *)&local_70);
        if (!bVar1) break;
        pVVar3 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_98);
        Json::Value::asString_abi_cxx11_((string *)&local_70,pVVar3);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
        std::operator<<(poVar4,", ");
        std::__cxx11::string::~string((string *)&local_70);
        Json::ValueIteratorBase::increment((ValueIteratorBase *)local_98);
      }
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      bVar1 = std::operator==(method,"alive");
      if (!bVar1) {
        bVar1 = std::operator==(method,"fill");
        if (bVar1) {
          bVar1 = Json::Value::empty(params);
          if (!bVar1) {
            pVVar3 = Json::Value::operator[](params,0);
            UVar2 = Json::Value::asUInt(pVVar3);
            if (0x19 < UVar2) {
              std::__cxx11::string::string((string *)&local_70,(string *)(local_78 + 0x40020));
              poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
              poVar4 = std::operator<<(poVar4,": ring buffer fill level is ");
              pVVar3 = Json::Value::operator[](params,0);
              Json::Value::asUInt(pVVar3);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              poVar4 = std::operator<<(poVar4,"%");
              std::endl<char,std::char_traits<char>>(poVar4);
              std::__cxx11::string::~string((string *)&local_70);
            }
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,"Meta information: ");
          poVar4 = std::operator<<(poVar4,(string *)method);
          poVar4 = std::operator<<(poVar4," ");
          Json::FastWriter::FastWriter(&local_70);
          Json::FastWriter::write_abi_cxx11_((FastWriter *)local_98,(int)&local_70,params,in_RCX);
          poVar4 = std::operator<<(poVar4,(string *)local_98);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)local_98);
          Json::FastWriter::~FastWriter(&local_70);
        }
      }
    }
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	if (method == hbm::streaming::META_METHOD_AVAILABLE) {
		std::cout << "The following signal(s) are available : ";
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
			signalReferences.push_back(element.asString());
		}
		std::cout << std::endl << std::endl;

		try {
			stream.subscribe(signalReferences);
			std::cout << "The following " << signalReferences.size() << " signal(s) were subscribed: ";
		} catch(const std::runtime_error& e) {
			std::cerr << "Error '" << e.what() << "' subscribing the following signal(s): ";
		}

		for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
			std::cout << "'" << *iter << "' ";
		}
		std::cout << std::endl << std::endl;

	} else if(method==hbm::streaming::META_METHOD_UNAVAILABLE) {
		std::cout << "The following signal(s) are not available anyore: ";

		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
		}
		std::cout << std::endl << std::endl;

	} else if(method==hbm::streaming::META_METHOD_ALIVE) {
		// We do ignore this. We are using TCP keep alive in order to detect communication problems.
	} else if(method==hbm::streaming::META_METHOD_FILL) {
		if(params.empty()==false) {
			unsigned int fill = params[0u].asUInt();
			if(fill>25) {
				std::cout << stream.address() << ": ring buffer fill level is " << params[0u].asUInt() << "%" << std::endl;
			}
		}
	} else {
		std::cout << "Meta information: " << method << " " << Json::FastWriter().write(params) << std::endl;
	}
}